

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::ModulusSubstitution::doSubstitution
          (ModulusSubstitution *this,double number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  NFRule *this_00;
  int32_t iVar1;
  double number_00;
  double numberToFormat;
  UErrorCode *status_local;
  int32_t recursionCount_local;
  int32_t _pos_local;
  UnicodeString *toInsertInto_local;
  double number_local;
  ModulusSubstitution *this_local;
  
  if (this->ruleToUse == (NFRule *)0x0) {
    NFSubstitution::doSubstitution
              (&this->super_NFSubstitution,number,toInsertInto,_pos,recursionCount,status);
  }
  else {
    (*(this->super_NFSubstitution).super_UObject._vptr_UObject[9])(number);
    this_00 = this->ruleToUse;
    iVar1 = NFSubstitution::getPos(&this->super_NFSubstitution);
    NFRule::doFormat(this_00,number_00,toInsertInto,_pos + iVar1,recursionCount,status);
  }
  return;
}

Assistant:

void
ModulusSubstitution::doSubstitution(double number, UnicodeString& toInsertInto, int32_t _pos, int32_t recursionCount, UErrorCode& status) const
{
    // if this isn't a >>> substitution, just use the inherited version
    // of this function (which uses either a rule set or a DecimalFormat
    // to format its substitution value)
    if (ruleToUse == NULL) {
        NFSubstitution::doSubstitution(number, toInsertInto, _pos, recursionCount, status);

        // a >>> substitution goes straight to a particular rule to
        // format the substitution value
    } else {
        double numberToFormat = transformNumber(number);

        ruleToUse->doFormat(numberToFormat, toInsertInto, _pos + getPos(), recursionCount, status);
    }
}